

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O1

Expression * __thiscall
soul::StructuralParser::parseInPlaceOpExpression
          (StructuralParser *this,bool allowAssignment,Expression *lhs,Op opType)

{
  Expression *args_2;
  InPlaceOperator *pIVar1;
  TokenType *in_R9;
  Context context;
  Op local_7c;
  Context local_78;
  Context local_60;
  CompileMessage local_48;
  
  local_78.location.sourceCode.object = (this->super_SOULTokeniser).location.sourceCode.object;
  if (local_78.location.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_78.location.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_78.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_78.location.location.data = (this->super_SOULTokeniser).location.location.data;
  local_78.parentScope = this->currentScope;
  local_7c = opType;
  if (allowAssignment) {
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::skip(&this->super_SOULTokeniser);
    args_2 = parseExpression(this,false);
    local_60.location.sourceCode.object = (this->super_SOULTokeniser).location.sourceCode.object;
    if (local_60.location.sourceCode.object != (SourceCodeText *)0x0) {
      ((local_60.location.sourceCode.object)->super_RefCountedObject).refCount =
           ((local_60.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    local_60.location.location.data = (this->super_SOULTokeniser).location.location.data;
    local_60.parentScope = this->currentScope;
    pIVar1 = PoolAllocator::
             allocate<soul::AST::InPlaceOperator,soul::AST::Context,soul::AST::Expression&,soul::AST::Expression&,soul::BinaryOp::Op&>
                       (&this->allocator->pool,&local_60,lhs,args_2,&local_7c);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_60.location.sourceCode.object);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_78.location.sourceCode.object);
    return &pIVar1->super_Expression;
  }
  CompileMessageHelpers::createMessage<soul::TokenType&>
            (&local_48,(CompileMessageHelpers *)0x1,none,0x284b1f,
             (char *)&(this->super_SOULTokeniser).currentType,in_R9);
  AST::Context::throwError(&local_78,&local_48,false);
}

Assistant:

AST::Expression& parseInPlaceOpExpression (bool allowAssignment, AST::Expression& lhs, BinaryOp::Op opType)
    {
        auto context = getContext();

        if (! allowAssignment)
            context.throwError (Errors::inPlaceOperatorMustBeStatement (currentType));

        skip();
        auto& rhs = parseExpression();
        return allocate<AST::InPlaceOperator> (getContext(), lhs, rhs, opType);
    }